

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# template_cache.cc
# Opt level: O1

bool __thiscall
ctemplate::TemplateCache::ResolveTemplateFilename
          (TemplateCache *this,string *unresolved,string *resolved,FileStat *statbuf)

{
  __off_t _Var1;
  bool bVar2;
  int iVar3;
  pointer a;
  ReaderMutexLock ml;
  ReaderMutexLock local_58;
  string local_50;
  
  local_58.mu_ = this->search_path_mutex_;
  if (((pthread_rwlock_t *)((long)local_58.mu_ + 0x38))->__size[0] == '\x01') {
    iVar3 = pthread_rwlock_rdlock((pthread_rwlock_t *)local_58.mu_);
    if (iVar3 != 0) {
      abort();
    }
  }
  if ((this->search_path_).
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start ==
      (this->search_path_).
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
LAB_00121f8f:
    std::__cxx11::string::_M_assign((string *)resolved);
    iVar3 = stat((resolved->_M_dataplus)._M_p,(stat *)&statbuf->internal_statbuf);
    if (iVar3 == 0) {
      _Var1 = (statbuf->internal_statbuf).st_size;
      statbuf->mtime = (statbuf->internal_statbuf).st_mtim.tv_sec;
      statbuf->length = _Var1;
LAB_0012204d:
      bVar2 = true;
      goto LAB_0012204f;
    }
  }
  else {
    bVar2 = IsAbspath(unresolved);
    if (bVar2) goto LAB_00121f8f;
    a = (this->search_path_).
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start;
    if (a != (this->search_path_).
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish) {
      do {
        PathJoin(&local_50,a,unresolved);
        std::__cxx11::string::operator=((string *)resolved,(string *)&local_50);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_50._M_dataplus._M_p != &local_50.field_2) {
          operator_delete(local_50._M_dataplus._M_p);
        }
        iVar3 = stat((resolved->_M_dataplus)._M_p,(stat *)&statbuf->internal_statbuf);
        if (iVar3 == 0) {
          _Var1 = (statbuf->internal_statbuf).st_size;
          statbuf->mtime = (statbuf->internal_statbuf).st_mtim.tv_sec;
          statbuf->length = _Var1;
          goto LAB_0012204d;
        }
        a = a + 1;
      } while (a != (this->search_path_).
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_finish);
    }
  }
  resolved->_M_string_length = 0;
  *(resolved->_M_dataplus)._M_p = '\0';
  bVar2 = false;
LAB_0012204f:
  ReaderMutexLock::~ReaderMutexLock(&local_58);
  return bVar2;
}

Assistant:

bool TemplateCache::ResolveTemplateFilename(const string& unresolved,
                                            string* resolved,
                                            FileStat* statbuf) const {
  ReaderMutexLock ml(search_path_mutex_);
  if (search_path_.empty() || IsAbspath(unresolved)) {
    *resolved = unresolved;
    if (File::Stat(*resolved, statbuf)) {
      VLOG(1) << "Resolved " << unresolved << " to " << *resolved << endl;
      return true;
    }
  } else {
    for (TemplateSearchPath::const_iterator path = search_path_.begin();
         path != search_path_.end();
         ++path) {
      *resolved = PathJoin(*path, unresolved);
      if (File::Stat(*resolved, statbuf)) {
        VLOG(1) << "Resolved " << unresolved << " to " << *resolved << endl;
        return true;
      }
    }
  }

  resolved->clear();
  return false;
}